

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandResubstitute(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Abc_Ntk_t *pNtk;
  undefined4 extraout_var;
  char *pcVar5;
  uint fVeryVerbose;
  char *pcVar6;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  undefined8 local_40;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  local_54 = 0;
  Extra_UtilGetoptReset();
  local_40 = 8;
  local_50 = 1;
  bVar1 = false;
  local_4c = 0;
  fVeryVerbose = 0;
  local_48 = local_50;
LAB_00225505:
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"KNFlzvwh"), iVar4 = globalUtilOptind, iVar2 == 0x77)
    {
      fVeryVerbose = fVeryVerbose ^ 1;
    }
    if (iVar2 == -1) {
      if (pNtk == (Abc_Ntk_t *)0x0) {
        pcVar5 = "Empty network.\n";
      }
      else {
        if ((int)local_40 - 0x11U < 0xfffffff3) {
          Abc_Print(-1,"Can only compute cuts for %d <= K <= %d.\n",4,0x10);
          return 1;
        }
        if (local_48 < 4) {
          if (pNtk->ntkType == ABC_NTK_STRASH) {
            iVar4 = Abc_NtkGetChoiceNum(pNtk);
            if (iVar4 == 0) {
              iVar4 = Abc_NtkResubstitute(pNtk,(int)local_40,local_48,local_54,local_50,local_4c,
                                          fVeryVerbose);
              if (iVar4 != 0) {
                return 0;
              }
              pcVar5 = "Refactoring has failed.\n";
            }
            else {
              pcVar5 = "AIG resynthesis cannot be applied to AIGs with choice nodes.\n";
            }
          }
          else {
            pcVar5 = "This command can only be applied to an AIG (run \"strash\").\n";
          }
        }
        else {
          pcVar5 = "Can only resubstitute at most 3 nodes.\n";
        }
      }
      iVar4 = -1;
      goto LAB_00225773;
    }
    if (iVar2 == 0x46) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-F\" should be followed by an integer.\n";
LAB_0022567f:
        Abc_Print(-1,pcVar5);
        goto LAB_00225689;
      }
      local_54 = atoi(argv[globalUtilOptind]);
      uVar3 = local_54;
    }
    else {
      if (iVar2 == 0x7a) {
        bVar1 = (bool)(bVar1 ^ 1);
        goto LAB_00225505;
      }
      if (iVar2 == 0x4e) {
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-N\" should be followed by an integer.\n";
          goto LAB_0022567f;
        }
        local_48 = atoi(argv[globalUtilOptind]);
        uVar3 = local_48;
      }
      else {
        if (iVar2 == 0x6c) {
          local_50 = local_50 ^ 1;
          goto LAB_00225505;
        }
        if (iVar2 == 0x76) {
          local_4c = local_4c ^ 1;
          goto LAB_00225505;
        }
        if (iVar2 != 0x4b) goto LAB_00225689;
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-K\" should be followed by an integer.\n";
          goto LAB_0022567f;
        }
        uVar3 = atoi(argv[globalUtilOptind]);
        local_40 = CONCAT44(extraout_var,uVar3);
      }
    }
    globalUtilOptind = iVar4 + 1;
    if ((int)uVar3 < 0) {
LAB_00225689:
      iVar4 = -2;
      Abc_Print(-2,"usage: resub [-KN <num>] [-lzvwh]\n");
      Abc_Print(-2,"\t           performs technology-independent restructuring of the AIG\n");
      Abc_Print(-2,"\t-K <num> : the max cut size (%d <= num <= %d) [default = %d]\n",4,0x10,
                local_40);
      Abc_Print(-2,"\t-N <num> : the max number of nodes to add (0 <= num <= 3) [default = %d]\n",
                (ulong)local_48);
      Abc_Print(-2,"\t-F <num> : the number of fanout levels for ODC computation [default = %d]\n",
                (ulong)local_54);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (local_50 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-l       : toggle preserving the number of levels [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (!bVar1) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-z       : toggle using zero-cost replacements [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_4c == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar5);
      if (fVeryVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-w       : toggle verbose printout of ODC computation [default = %s]\n",pcVar6
               );
      pcVar5 = "\t-h       : print the command usage\n";
LAB_00225773:
      Abc_Print(iVar4,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandResubstitute( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int RS_CUT_MIN =  4;
    int RS_CUT_MAX = 16;
    int c;
    int nCutsMax;
    int nNodesMax;
    int nLevelsOdc;
    int fUpdateLevel;
    int fUseZeros;
    int fVerbose;
    int fVeryVerbose;
    extern int Abc_NtkResubstitute( Abc_Ntk_t * pNtk, int nCutsMax, int nNodesMax, int nLevelsOdc, int fUpdateLevel, int fVerbose, int fVeryVerbose );

    // set defaults
    nCutsMax     =  8;
    nNodesMax    =  1;
    nLevelsOdc   =  0;
    fUpdateLevel =  1;
    fUseZeros    =  0;
    fVerbose     =  0;
    fVeryVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KNFlzvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutsMax < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nNodesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNodesMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevelsOdc = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevelsOdc < 0 )
                goto usage;
            break;
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'z':
            fUseZeros ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( nCutsMax < RS_CUT_MIN || nCutsMax > RS_CUT_MAX )
    {
        Abc_Print( -1, "Can only compute cuts for %d <= K <= %d.\n", RS_CUT_MIN, RS_CUT_MAX );
        return 1;
    }
    if ( nNodesMax < 0 || nNodesMax > 3 )
    {
        Abc_Print( -1, "Can only resubstitute at most 3 nodes.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to an AIG (run \"strash\").\n" );
        return 1;
    }
    if ( Abc_NtkGetChoiceNum(pNtk) )
    {
        Abc_Print( -1, "AIG resynthesis cannot be applied to AIGs with choice nodes.\n" );
        return 1;
    }

    // modify the current network
    if ( !Abc_NtkResubstitute( pNtk, nCutsMax, nNodesMax, nLevelsOdc, fUpdateLevel, fVerbose, fVeryVerbose ) )
    {
        Abc_Print( -1, "Refactoring has failed.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: resub [-KN <num>] [-lzvwh]\n" );
    Abc_Print( -2, "\t           performs technology-independent restructuring of the AIG\n" );
    Abc_Print( -2, "\t-K <num> : the max cut size (%d <= num <= %d) [default = %d]\n", RS_CUT_MIN, RS_CUT_MAX, nCutsMax );
    Abc_Print( -2, "\t-N <num> : the max number of nodes to add (0 <= num <= 3) [default = %d]\n", nNodesMax );
    Abc_Print( -2, "\t-F <num> : the number of fanout levels for ODC computation [default = %d]\n", nLevelsOdc );
    Abc_Print( -2, "\t-l       : toggle preserving the number of levels [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-z       : toggle using zero-cost replacements [default = %s]\n", fUseZeros? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle verbose printout of ODC computation [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}